

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_226e062::Toolchains::DumpToolchainVariable
          (Toolchains *this,cmMakefile *mf,Value *object,string *lang,ToolchainVariable *variable)

{
  cmValue cVar1;
  Value *pVVar2;
  pointer value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string variableName;
  cmList values;
  Value jsonArray;
  string local_f0;
  cmList local_d0;
  ValueHolder local_b8;
  char *local_b0;
  undefined8 local_a8;
  string *local_a0;
  Value *local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  Value local_58;
  
  local_b8.int_ = 6;
  local_b0 = "CMAKE_";
  local_a8 = 0;
  local_90 = 0;
  local_88 = 1;
  local_80 = "_";
  local_78 = 0;
  local_68 = (variable->VariableSuffix)._M_dataplus._M_p;
  local_70 = (variable->VariableSuffix)._M_string_length;
  local_60 = 0;
  views._M_len = 4;
  views._M_array = (iterator)&local_b8;
  local_a0 = lang;
  local_98 = object;
  cmCatViews(&local_f0,views);
  if (variable->IsList == true) {
    cVar1 = cmMakefile::GetDefinition((cmMakefile *)this,&local_f0);
    if (cVar1.Value != (string *)0x0) {
      cmList::cmList(&local_d0,cVar1,Yes,No);
      Json::Value::Value((Value *)&local_b8,arrayValue);
      if (local_d0.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_d0.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        value = local_d0.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          Json::Value::Value(&local_58,value);
          Json::Value::append((Value *)&local_b8,&local_58);
          Json::Value::~Value(&local_58);
          value = value + 1;
        } while (value != local_d0.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      pVVar2 = Json::Value::operator[]((Value *)mf,&variable->ObjectKey);
      Json::Value::operator=(pVVar2,(Value *)&local_b8);
      Json::Value::~Value((Value *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d0.Values);
    }
  }
  else {
    cVar1 = cmMakefile::GetDefinition((cmMakefile *)this,&local_f0);
    if (cVar1.Value != (string *)0x0) {
      Json::Value::Value((Value *)&local_b8,cVar1.Value);
      pVVar2 = Json::Value::operator[]((Value *)mf,&variable->ObjectKey);
      Json::Value::operator=(pVVar2,(Value *)&local_b8);
      Json::Value::~Value((Value *)&local_b8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Toolchains::DumpToolchainVariable(cmMakefile const* mf,
                                       Json::Value& object,
                                       std::string const& lang,
                                       ToolchainVariable const& variable)
{
  std::string const variableName =
    cmStrCat("CMAKE_", lang, "_", variable.VariableSuffix);

  if (variable.IsList) {
    cmValue data = mf->GetDefinition(variableName);
    if (data) {
      cmList values(data);
      Json::Value jsonArray = Json::arrayValue;
      for (auto const& value : values) {
        jsonArray.append(value);
      }
      object[variable.ObjectKey] = jsonArray;
    }
  } else {
    cmValue def = mf->GetDefinition(variableName);
    if (def) {
      object[variable.ObjectKey] = *def;
    }
  }
}